

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int32_t tpl_get_satd_cost(BitDepthInfo bd_info,int16_t *src_diff,int diff_stride,uint8_t *src,
                         int src_stride,uint8_t *dst,int dst_stride,tran_low_t *coeff,int bw,int bh,
                         TX_SIZE tx_size)

{
  int iVar1;
  BitDepthInfo in_RCX;
  undefined4 in_EDX;
  ptrdiff_t in_RSI;
  int in_R8D;
  BitDepthInfo in_R9;
  int in_stack_00000008;
  tran_low_t *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int pix_num;
  tran_low_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  TX_SIZE in_stack_ffffffffffffffdb;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = in_stack_00000018 * in_stack_00000020;
  av1_subtract_block(in_R9,iVar1,in_stack_ffffffffffffffc8,(int16_t *)in_stack_ffffffffffffffc0,
                     (long)in_stack_00000008,(uint8_t *)in_R9,(ptrdiff_t)in_RCX,
                     (uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RSI);
  av1_quick_txfm(in_R8D,in_stack_ffffffffffffffdb,in_RCX,(int16_t *)in_R9,iVar1,
                 in_stack_ffffffffffffffc0);
  iVar1 = (*aom_satd)(in_stack_00000010,iVar1);
  return iVar1;
}

Assistant:

static inline int32_t tpl_get_satd_cost(BitDepthInfo bd_info, int16_t *src_diff,
                                        int diff_stride, const uint8_t *src,
                                        int src_stride, const uint8_t *dst,
                                        int dst_stride, tran_low_t *coeff,
                                        int bw, int bh, TX_SIZE tx_size) {
  const int pix_num = bw * bh;

  av1_subtract_block(bd_info, bh, bw, src_diff, diff_stride, src, src_stride,
                     dst, dst_stride);
  av1_quick_txfm(/*use_hadamard=*/0, tx_size, bd_info, src_diff, bw, coeff);
  return aom_satd(coeff, pix_num);
}